

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O0

asn_enc_rval_t *
NativeEnumerated_encode_uper
          (asn_TYPE_descriptor_t *td,asn_per_constraints_t *constraints,void *sptr,
          asn_per_outp_t *po)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long *in_RCX;
  asn_per_constraints_t *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  asn_enc_rval_t *tmp_error;
  int cmpWith;
  asn_INTEGER_enum_map_t *kf;
  asn_INTEGER_enum_map_t key;
  int inext;
  asn_per_constraint_t *ct;
  long value;
  long native;
  asn_enc_rval_t er;
  asn_INTEGER_specifics_t *specs;
  asn_per_outp_t *in_stack_fffffffffffffed8;
  int local_104;
  undefined8 in_stack_ffffffffffffff10;
  asn_per_outp_t *in_stack_ffffffffffffff18;
  char *pcVar4;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  int local_c4;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  long local_78 [3];
  uint local_5c;
  asn_per_constraints_t *local_58;
  long local_50;
  long local_48;
  ssize_t local_40;
  long *local_28;
  long *local_18;
  asn_TYPE_descriptor_s *local_8;
  
  local_28 = (long *)in_RSI->specifics;
  local_5c = 0;
  if (in_RCX == (long *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = (void *)0x0;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_a0 = "";
    }
    else {
      local_a0 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_a0);
  }
  else if (local_28 == (long *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = in_RCX;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_a8 = "";
    }
    else {
      local_a8 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_a8);
  }
  else {
    local_58 = in_RDX;
    if (in_RDX == (asn_per_constraints_t *)0x0) {
      if (in_RSI->per_constraints == (asn_per_constraints_t *)0x0) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = in_RSI;
        in_RDI->structure_ptr = in_RCX;
        if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
          local_b0 = "";
        }
        else {
          local_b0 = in_RSI->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_b0);
        return in_RDI;
      }
      local_58 = in_RSI->per_constraints;
    }
    local_18 = in_RCX;
    local_8 = in_RSI;
    ASN_DEBUG("Encoding %s as NativeEnumerated",in_RSI->name);
    local_40 = 0;
    local_78[0] = *local_18;
    local_48 = local_78[0];
    if (local_78[0] < 0) {
      in_RDI->encoded = -1;
      in_RDI->failed_type = local_8;
      in_RDI->structure_ptr = local_18;
      if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
        local_b8 = "";
      }
      else {
        local_b8 = local_8->name;
      }
      ASN_DEBUG("Failed to encode element %s",local_b8);
    }
    else {
      pvVar3 = bsearch(local_78,(void *)*local_28,(long)(int)local_28[2],0x18,
                       NativeEnumerated__compar_value2enum);
      if (pvVar3 == (void *)0x0) {
        ASN_DEBUG("No element corresponds to %ld",local_48);
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_8;
        in_RDI->structure_ptr = local_18;
        if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
          local_c0 = "";
        }
        else {
          local_c0 = local_8->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_c0);
      }
      else {
        lVar1 = *local_28;
        local_50 = ((long)pvVar3 - lVar1) / 0x18;
        if (-1 < (local_58->value).range_bits) {
          if (*(int *)((long)local_28 + 0x14) == 0) {
            local_c4 = (int)local_28[2];
          }
          else {
            local_c4 = *(int *)((long)local_28 + 0x14) + -1;
          }
          if (local_c4 <= local_50) {
            local_5c = 1;
          }
        }
        if (((local_58->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
          if (local_5c != 0) {
            in_RDI->encoded = -1;
            in_RDI->failed_type = local_8;
            in_RDI->structure_ptr = local_18;
            if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
              local_d8 = "";
            }
            else {
              local_d8 = local_8->name;
            }
            ASN_DEBUG("Failed to encode element %s",local_d8,((long)pvVar3 - lVar1) % 0x18);
            return in_RDI;
          }
        }
        else {
          iVar2 = per_put_few_bits(in_stack_ffffffffffffff18,
                                   (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          if (iVar2 != 0) {
            in_RDI->encoded = -1;
            in_RDI->failed_type = local_8;
            in_RDI->structure_ptr = local_18;
            if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
              local_d0 = "";
            }
            else {
              local_d0 = local_8->name;
            }
            ASN_DEBUG("Failed to encode element %s",local_d0);
            return in_RDI;
          }
          if (local_5c != 0) {
            local_58 = (asn_per_constraints_t *)0x0;
          }
        }
        if ((local_58 == (asn_per_constraints_t *)0x0) || ((local_58->value).range_bits < 0)) {
          if (*(int *)((long)local_28 + 0x14) == 0) {
            in_RDI->encoded = -1;
            in_RDI->failed_type = local_8;
            in_RDI->structure_ptr = local_18;
            if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = local_8->name;
            }
            ASN_DEBUG("Failed to encode element %s",pcVar4);
          }
          else {
            if (local_5c == 0) {
              local_104 = 0;
            }
            else {
              local_104 = *(int *)((long)local_28 + 0x14) + -1;
            }
            ASN_DEBUG("value = %ld, ext = %d, inext = %d, res = %ld",local_50,
                      (ulong)*(uint *)((long)local_28 + 0x14),(ulong)local_5c,local_50 - local_104);
            iVar2 = uper_put_nsnnwn(in_stack_fffffffffffffed8,0);
            if (iVar2 == 0) {
              in_RDI->encoded = local_40;
              in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
              in_RDI->structure_ptr = (void *)0x0;
            }
            else {
              in_RDI->encoded = -1;
              in_RDI->failed_type = local_8;
              in_RDI->structure_ptr = local_18;
              if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = local_8->name;
              }
              ASN_DEBUG("Failed to encode element %s",pcVar4);
            }
          }
        }
        else {
          iVar2 = per_put_few_bits(in_stack_ffffffffffffff18,
                                   (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          if (iVar2 == 0) {
            in_RDI->encoded = local_40;
            in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
            in_RDI->structure_ptr = (void *)0x0;
          }
          else {
            in_RDI->encoded = -1;
            in_RDI->failed_type = local_8;
            in_RDI->structure_ptr = local_18;
            if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
              local_e0 = "";
            }
            else {
              local_e0 = local_8->name;
            }
            ASN_DEBUG("Failed to encode element %s",local_e0);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
NativeEnumerated_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_INTEGER_specifics_t *specs = (asn_INTEGER_specifics_t *)td->specifics;
	asn_enc_rval_t er;
	long native, value;
	asn_per_constraint_t *ct;
	int inext = 0;
	asn_INTEGER_enum_map_t key;
	const asn_INTEGER_enum_map_t *kf;

	if(!sptr) ASN__ENCODE_FAILED;
	if(!specs) ASN__ENCODE_FAILED;

	if(constraints) ct = &constraints->value;
	else if(td->per_constraints) ct = &td->per_constraints->value;
	else ASN__ENCODE_FAILED;	/* Mandatory! */

	ASN_DEBUG("Encoding %s as NativeEnumerated", td->name);

	er.encoded = 0;

	native = *(long *)sptr;
	if(native < 0) ASN__ENCODE_FAILED;

	key.nat_value = native;
	kf = bsearch(&key, specs->value2enum, specs->map_count,
		sizeof(key), NativeEnumerated__compar_value2enum);
	if(!kf) {
		ASN_DEBUG("No element corresponds to %ld", native);
		ASN__ENCODE_FAILED;
	}
	value = kf - specs->value2enum;

	if(ct->range_bits >= 0) {
		int cmpWith = specs->extension
				? specs->extension - 1 : specs->map_count;
		if(value >= cmpWith)
			inext = 1;
	}
	if(ct->flags & APC_EXTENSIBLE) {
		if(per_put_few_bits(po, inext, 1))
			ASN__ENCODE_FAILED;
		if(inext) ct = 0;
	} else if(inext) {
		ASN__ENCODE_FAILED;
	}

	if(ct && ct->range_bits >= 0) {
		if(per_put_few_bits(po, value, ct->range_bits))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	if(!specs->extension)
		ASN__ENCODE_FAILED;

	/*
	 * X.691, #10.6: normally small non-negative whole number;
	 */
	ASN_DEBUG("value = %ld, ext = %d, inext = %d, res = %ld",
		value, specs->extension, inext,
		value - (inext ? (specs->extension - 1) : 0));
	if(uper_put_nsnnwn(po, value - (inext ? (specs->extension - 1) : 0)))
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}